

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_dup16i_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_vec r,uint32_t a)

{
  uint32_t a_local;
  TCGv_vec r_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  do_dupi_vec(tcg_ctx,r,3,(ulong)(a & 0xffff) * 0x1000100010001);
  return;
}

Assistant:

void tcg_gen_dup16i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint32_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(MO_16, a));
}